

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall jbcoin::Logs::threshold(Logs *this,Severity thresh)

{
  bool bVar1;
  reference ppVar2;
  pointer pSVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>
  *sink;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>,_beast::iless,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>_>
  *__range1;
  lock_guard<std::mutex> lock;
  Severity thresh_local;
  Logs *this_local;
  
  lock._M_device._4_4_ = thresh;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->mutex_);
  this->thresh_ = lock._M_device._4_4_;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>,_beast::iless,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>_>
           ::begin(&this->sinks_);
  sink = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>,_beast::iless,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>_>
            ::end(&this->sinks_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&sink);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>
             ::operator*(&__end1);
    pSVar3 = std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>::
             operator->(&ppVar2->second);
    (*pSVar3->_vptr_Sink[6])(pSVar3,(ulong)lock._M_device._4_4_);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>
    ::operator++(&__end1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void
Logs::threshold (beast::severities::Severity thresh)
{
    std::lock_guard <std::mutex> lock (mutex_);
    thresh_ = thresh;
    for (auto& sink : sinks_)
        sink.second->threshold (thresh);
}